

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstreams.cpp
# Opt level: O3

ssize_t __thiscall HPack::BitIStream::read(BitIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  Error *pEVar1;
  ulong uVar2;
  uchar *puVar3;
  ulong __nbytes_00;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  ulong uVar8;
  uint uVar9;
  
  uVar2 = this->offset;
  puVar3 = this->first;
  uVar8 = ((long)this->last - (long)puVar3) * 8;
  pEVar1 = &this->streamError;
  if (uVar8 <= uVar2) {
    *pEVar1 = NotEnoughData;
    return 0;
  }
  uVar6 = 8 - ((uint)uVar2 & 7);
  *pEVar1 = NoError;
  uVar7 = ~(-1 << ((byte)uVar6 & 0x1f));
  bVar4 = puVar3[uVar2 >> 3] & (byte)uVar7;
  uVar9 = (uint)bVar4;
  if (bVar4 < uVar7) {
    *(uint *)CONCAT44(in_register_00000034,__fd) = (uint)bVar4;
    __nbytes_00 = (ulong)uVar6;
    this->offset = uVar2 + __nbytes_00;
  }
  else {
    __nbytes_00 = (ulong)(uVar6 + (uint)uVar2);
    iVar5 = 0;
    do {
      if (uVar8 <= __nbytes_00) {
        *pEVar1 = NotEnoughData;
        return 0;
      }
      bVar4 = puVar3[__nbytes_00 >> 3];
      if ((iVar5 == 0x1c) && (0xf < bVar4)) {
        read((int)pEVar1,(void *)CONCAT44(in_register_00000034,__fd),__nbytes_00);
        return 0;
      }
      uVar9 = uVar9 + ((bVar4 & 0x7f) << ((byte)iVar5 & 0x1f));
      __nbytes_00 = (ulong)((int)__nbytes_00 + 8);
      iVar5 = iVar5 + 7;
    } while ((char)bVar4 < '\0');
    *(uint *)CONCAT44(in_register_00000034,__fd) = uVar9;
    this->offset = __nbytes_00;
  }
  return CONCAT71((int7)(__nbytes_00 >> 8),1);
}

Assistant:

bool BitIStream::read(quint32 *dstPtr)
{
    Q_ASSERT(dstPtr);
    quint32 &dst = *dstPtr;

    // 5.1 Integer Representation
    //
    // Integers are used to represent name indexes, header field indexes, or string lengths.
    // An integer representation can start anywhere within an octet.
    // To allow for optimized processing, an integer representation always finishes at the end of an octet.
    // An integer is represented in two parts: a prefix that fills the current octet and an optional
    // list of octets that are used if the integer value does not fit within the prefix.
    // The number of bits of the prefix (called N) is a parameter of the integer representation.
    // If the integer value is small enough, i.e., strictly less than 2N-1, it is compressed within the N-bit prefix.
    // ...
    // The prefix size, N, is always between 1 and 8 bits. An integer
    // starting at an octet boundary will have an 8-bit prefix.

    // Technically, such integers can be of any size, but as we do not have arbitrary-long integers,
    // everything that does not fit into 'dst' we consider as an error (after all, try to allocate a string
    // of such size and ... hehehe - send it as a part of a header!

    // This function updates the offset _only_ if the read was successful.
    if (offset >= bitLength()) {
        setError(Error::NotEnoughData);
        return false;
    }

    setError(Error::NoError);

    const quint32 prefixLen = 8 - offset % 8;
    const quint32 fullPrefix = (1 << prefixLen) - 1;

    const uchar prefix = uchar(first[offset / 8] & fullPrefix);
    if (prefix < fullPrefix) {
        // The number fitted into the prefix bits.
        dst = prefix;
        offset += prefixLen;
        return true;
    }

    quint32 newOffset = offset + prefixLen;
    // We have a list of bytes representing an integer ...
    quint64 val = prefix;
    quint32 octetPower = 0;

    while (true) {
        if (newOffset >= bitLength()) {
            setError(Error::NotEnoughData);
            return false;
        }

        const uchar octet = first[newOffset / 8];

        if (octetPower == 28 && octet > 15) {
            qCritical("integer is too big");
            setError(Error::InvalidInteger);
            return false;
        }

        val += quint32(octet & 0x7f) << octetPower;
        newOffset += 8;

        if (!(octet & 0x80)) {
            // The most significant bit of each octet is used
            // as a continuation flag: its value is set to 1
            // except for the last octet in the list.
            break;
        }

        octetPower += 7;
    }

    dst = val;
    offset = newOffset;
    Q_ASSERT(!(offset % 8));

    return true;
}